

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d57_q2_heap_order2.cpp
# Opt level: O3

bool __thiscall student::operator<(student *this,student *rhs)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *v;
  int *piVar5;
  
  piVar5 = (this->scores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (this->scores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar3 = 0;
  iVar4 = 0;
  if (piVar5 != piVar1) {
    iVar4 = 0;
    do {
      iVar4 = iVar4 + *piVar5;
      piVar5 = piVar5 + 1;
    } while (piVar5 != piVar1);
  }
  piVar5 = (rhs->scores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (rhs->scores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar5 != piVar1) {
    iVar3 = 0;
    do {
      iVar3 = iVar3 + *piVar5;
      piVar5 = piVar5 + 1;
    } while (piVar5 != piVar1);
  }
  if (iVar4 == iVar3) {
    iVar3 = std::__cxx11::string::compare((string *)this);
    bVar2 = 0 < iVar3;
  }
  else {
    bVar2 = iVar4 < iVar3;
  }
  return bVar2;
}

Assistant:

bool operator<(const student &rhs) const {
    int ls = sum_score();
    int rs = rhs.sum_score();
    return ls != rs ? ls < rs : name > rhs.name;
  }